

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O3

void calc_similarity<double,long>
               (double *numeric_data,int *categ_data,double *Xc,long *Xc_ind,long *Xc_indptr,
               size_t nrows,bool use_long_double,int nthreads,bool assume_full_distr,
               bool standardize_dist,bool as_kernel,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,double *tmat,double *rmat,size_t n_from,
               bool use_indexed_references,TreesIndexer *indexer,bool is_col_major,size_t ld_numeric
               ,size_t ld_categ)

{
  if (use_long_double) {
    calc_similarity_internal<double,long,long_double>
              (numeric_data,categ_data,Xc,Xc_ind,Xc_indptr,nrows,nthreads,assume_full_distr,
               standardize_dist,as_kernel,model_outputs,model_outputs_ext,tmat,rmat,n_from,
               use_indexed_references,indexer,is_col_major,ld_numeric,ld_categ);
  }
  else {
    calc_similarity_internal<double,long,double>
              (numeric_data,categ_data,Xc,Xc_ind,Xc_indptr,nrows,nthreads,assume_full_distr,
               standardize_dist,as_kernel,model_outputs,model_outputs_ext,tmat,rmat,n_from,
               use_indexed_references,indexer,is_col_major,ld_numeric,ld_categ);
  }
  return;
}

Assistant:

void calc_similarity(real_t numeric_data[], int categ_data[],
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     size_t nrows, bool use_long_double, int nthreads,
                     bool assume_full_distr, bool standardize_dist, bool as_kernel,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double tmat[], double rmat[], size_t n_from, bool use_indexed_references,
                     TreesIndexer *indexer, bool is_col_major, size_t ld_numeric, size_t ld_categ)
{
    if (use_long_double && !has_long_double()) {
        use_long_double = false;
        print_errmsg("Passed 'use_long_double=true', but library was compiled without long double support.\n");
    }
    #ifndef NO_LONG_DOUBLE
    if (likely(!use_long_double))
    #endif
        calc_similarity_internal<real_t, sparse_ix, double>(
            numeric_data, categ_data,
            Xc, Xc_ind, Xc_indptr,
            nrows, nthreads,
            assume_full_distr, standardize_dist, as_kernel,
            model_outputs, model_outputs_ext,
            tmat, rmat, n_from, use_indexed_references,
            indexer, is_col_major, ld_numeric, ld_categ
        );
    #ifndef NO_LONG_DOUBLE
    else
        calc_similarity_internal<real_t, sparse_ix, long double>(
            numeric_data, categ_data,
            Xc, Xc_ind, Xc_indptr,
            nrows, nthreads,
            assume_full_distr, standardize_dist, as_kernel,
            model_outputs, model_outputs_ext,
            tmat, rmat, n_from, use_indexed_references,
            indexer, is_col_major, ld_numeric, ld_categ
        );
    #endif
}